

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lu_byte luaH_get(Table *t,TValue *key,TValue *res)

{
  byte bVar1;
  lu_byte lVar2;
  int iVar3;
  TValue *val;
  lua_Integer k;
  lua_Integer local_20;
  
  bVar1 = key->tt_ & 0x3f;
  if ((key->tt_ & 0x3f) == 0) {
    val = &absentkey;
  }
  else {
    if (bVar1 == 3) {
      lVar2 = luaH_getint(t,(key->value_).i,res);
      return lVar2;
    }
    if (bVar1 == 0x13) {
      iVar3 = luaV_flttointeger((key->value_).n,&local_20,F2Ieq);
      if (iVar3 != 0) {
        lVar2 = luaH_getint(t,local_20,res);
        return lVar2;
      }
    }
    else if (bVar1 == 4) {
      val = luaH_Hgetshortstr(t,(TString *)(key->value_).gc);
      goto LAB_00118fcd;
    }
    val = getgeneric(t,key,0);
  }
LAB_00118fcd:
  lVar2 = finishnodeget(val,res);
  return lVar2;
}

Assistant:

lu_byte luaH_get (Table *t, const TValue *key, TValue *res) {
  const TValue *slot;
  switch (ttypetag(key)) {
    case LUA_VSHRSTR:
      slot = luaH_Hgetshortstr(t, tsvalue(key));
      break;
    case LUA_VNUMINT:
      return luaH_getint(t, ivalue(key), res);
    case LUA_VNIL:
      slot = &absentkey;
      break;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k, res);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      slot = getgeneric(t, key, 0);
      break;
  }
  return finishnodeget(slot, res);
}